

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::binary_logisim16(char *file_name,uint lower_address,uint higher_address)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ostream *poVar3;
  uint uVar4;
  ofstream file;
  
  std::ofstream::ofstream(&file,file_name,_S_out);
  poVar3 = std::operator<<((ostream *)&file,"v2.0 raw");
  std::endl<char,std::char_traits<char>>(poVar3);
  do {
    while( true ) {
      if (higher_address <= lower_address) {
        std::ofstream::close();
        std::ofstream::~ofstream(&file);
        return;
      }
      uVar1 = Memory_space::read16((Memory_space *)memory,lower_address);
      uVar2 = Memory_space::read16((Memory_space *)memory,lower_address + 2);
      if (uVar2 == uVar1) break;
      ostream_printf((ostream *)&file," %04x",(ulong)(uint)uVar1);
      lower_address = lower_address + 2;
    }
    uVar4 = 2;
    for (lower_address = lower_address + 4; lower_address < higher_address;
        lower_address = lower_address + 2) {
      uVar2 = Memory_space::read16((Memory_space *)memory,lower_address);
      if (uVar1 != uVar2) break;
      uVar4 = uVar4 + 1;
    }
    ostream_printf((ostream *)&file," %d*%04x",(ulong)uVar4,(ulong)(uint)uVar1);
  } while( true );
}

Assistant:

void Sections::binary_logisim16(const char *file_name, unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		file << "v2.0 raw" << endl;
		for (auto address = lower_address; address < higher_address; ) {
			auto c = memory.read16(address);
			address += 2;
			//	Quantas palavras iguais a esta?
			if (memory.read16(address) == c) {
				auto j = 2U;
				for (address += 2;
				     	address < higher_address && c == memory.read16(address);
					 		address += 2, j++)
					;
				ostream_printf(file, " %d*%04x", j, static_cast<uint16_t >(c));
			}
			else
				ostream_printf(file, " %04x", static_cast<uint16_t >(c));
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}